

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O3

int OPENSSL_strcasecmp(char *a,char *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar2 = (uint)*a;
  uVar1 = uVar2 | 0x20;
  if (0x19 < uVar2 - 0x41) {
    uVar1 = uVar2;
  }
  uVar3 = (uint)*b;
  uVar2 = uVar3 | 0x20;
  if (0x19 < uVar3 - 0x41) {
    uVar2 = uVar3;
  }
  if ((int)uVar2 <= (int)uVar1) {
    lVar4 = 1;
    do {
      if ((int)uVar2 < (int)uVar1) {
        return 1;
      }
      if (uVar1 == 0) {
        return 0;
      }
      uVar2 = (uint)a[lVar4];
      uVar1 = uVar2 | 0x20;
      if (0x19 < uVar2 - 0x41) {
        uVar1 = uVar2;
      }
      uVar3 = (uint)b[lVar4];
      uVar2 = uVar3 | 0x20;
      if (0x19 < uVar3 - 0x41) {
        uVar2 = uVar3;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar2 <= (int)uVar1);
  }
  return -1;
}

Assistant:

int OPENSSL_strcasecmp(const char *a, const char *b) {
  for (size_t i = 0;; i++) {
    const int aa = OPENSSL_tolower(a[i]);
    const int bb = OPENSSL_tolower(b[i]);

    if (aa < bb) {
      return -1;
    } else if (aa > bb) {
      return 1;
    } else if (aa == 0) {
      return 0;
    }
  }
}